

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O2

void __thiscall xercesc_4_0::CMStateSet::CMStateSet(CMStateSet *this,CMStateSet *toCopy)

{
  MemoryManager *pMVar1;
  undefined8 uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLSize_t XVar5;
  XMLSize_t index;
  ulong uVar6;
  CMDynamicBuffer *pCVar4;
  
  uVar6 = toCopy->fBitCount;
  this->fBitCount = uVar6;
  this->fDynamicBuffer = (CMDynamicBuffer *)0x0;
  if (uVar6 < 0x81) {
    uVar2 = *(undefined8 *)(toCopy->fBits + 2);
    *(undefined8 *)this->fBits = *(undefined8 *)toCopy->fBits;
    *(undefined8 *)(this->fBits + 2) = uVar2;
  }
  else {
    pMVar1 = toCopy->fDynamicBuffer->fMemoryManager;
    iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x18);
    pCVar4 = (CMDynamicBuffer *)CONCAT44(extraout_var,iVar3);
    this->fDynamicBuffer = pCVar4;
    pMVar1 = toCopy->fDynamicBuffer->fMemoryManager;
    pCVar4->fMemoryManager = pMVar1;
    XVar5 = ((this->fBitCount >> 10) + 1) - (ulong)((this->fBitCount & 0x3ff) == 0);
    pCVar4->fArraySize = XVar5;
    iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,XVar5 * 8);
    pCVar4 = this->fDynamicBuffer;
    pCVar4->fBitArray = (XMLInt32 **)CONCAT44(extraout_var_00,iVar3);
    for (uVar6 = 0; uVar6 < pCVar4->fArraySize; uVar6 = uVar6 + 1) {
      if (toCopy->fDynamicBuffer->fBitArray[uVar6] == (XMLInt32 *)0x0) {
        pCVar4->fBitArray[uVar6] = (XMLInt32 *)0x0;
      }
      else {
        allocateChunk(this,uVar6);
        memcpy(this->fDynamicBuffer->fBitArray[uVar6],toCopy->fDynamicBuffer->fBitArray[uVar6],0x80)
        ;
      }
      pCVar4 = this->fDynamicBuffer;
    }
  }
  return;
}

Assistant:

CMStateSet(const CMStateSet& toCopy) :
        XMemory(toCopy)
      , fBitCount(toCopy.fBitCount)
      , fDynamicBuffer(0)
    {
        //
        //  See if we need to allocate the byte array or whether we can live
        //  within the cahced bit high performance scheme.
        //
        if (fBitCount > (CMSTATE_CACHED_INT32_SIZE * 32))
        {
            fDynamicBuffer = (CMDynamicBuffer*) toCopy.fDynamicBuffer->fMemoryManager->allocate(sizeof(CMDynamicBuffer));
            fDynamicBuffer->fMemoryManager = toCopy.fDynamicBuffer->fMemoryManager;
            fDynamicBuffer->fArraySize = fBitCount / CMSTATE_BITFIELD_CHUNK;
            if (fBitCount % CMSTATE_BITFIELD_CHUNK)
                fDynamicBuffer->fArraySize++;
            fDynamicBuffer->fBitArray = (XMLInt32**) fDynamicBuffer->fMemoryManager->allocate(fDynamicBuffer->fArraySize*sizeof(XMLInt32*));
            for(XMLSize_t index = 0; index < fDynamicBuffer->fArraySize; index++)
            {
                if(toCopy.fDynamicBuffer->fBitArray[index]!=NULL)
                {
                    allocateChunk(index);
                    memcpy((void *) fDynamicBuffer->fBitArray[index],
                           (const void *) toCopy.fDynamicBuffer->fBitArray[index],
                           CMSTATE_BITFIELD_INT32_SIZE * sizeof(XMLInt32));
                }
                else
                    fDynamicBuffer->fBitArray[index]=NULL;
            }
        }
        else
        {
            memcpy((void *) fBits,
                   (const void *) toCopy.fBits,
                   CMSTATE_CACHED_INT32_SIZE * sizeof(XMLInt32));
        }
    }